

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * hashTypeToUString(CBString *__return_storage_ptr__,UINT16 algorithm_id)

{
  UINT16 algorithm_id_local;
  
  switch(algorithm_id) {
  case 4:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SHA1");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %04Xh",(ulong)algorithm_id);
    break;
  case 0xb:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SHA256");
    break;
  case 0xc:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SHA384");
    break;
  case 0xd:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SHA512");
    break;
  case 0x10:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"NULL");
    break;
  case 0x12:
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SM3");
  }
  return __return_storage_ptr__;
}

Assistant:

UString hashTypeToUString(const UINT16 algorithm_id)
{
    switch (algorithm_id) {
        case TCG_HASH_ALGORITHM_ID_SHA1:   return UString("SHA1");
        case TCG_HASH_ALGORITHM_ID_SHA256: return UString("SHA256");
        case TCG_HASH_ALGORITHM_ID_SHA384: return UString("SHA384");
        case TCG_HASH_ALGORITHM_ID_SHA512: return UString("SHA512");
        case TCG_HASH_ALGORITHM_ID_NULL:   return UString("NULL");
        case TCG_HASH_ALGORITHM_ID_SM3:    return UString("SM3");
    }
    
    return usprintf("Unknown %04Xh", algorithm_id);
}